

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O3

void project_monster_handler_NETHER(project_monster_handler_context_t *context)

{
  _Bool _Var1;
  uint32_t uVar2;
  char *fi;
  int flag;
  size_t size;
  bitflag *flags;
  char *fl;
  
  if (context->seen == true) {
    flag_on_dbg(context->lore->flags,0xc,0x49,"context->lore->flags","RF_UNDEAD");
    flag_on_dbg(context->lore->flags,0xc,0x55,"context->lore->flags","RF_IM_NETHER");
    _Var1 = flag_has_dbg(context->mon->race->flags,0xc,0x49,"context->mon->race->flags","RF_UNDEAD")
    ;
    if (!_Var1) {
      _Var1 = flag_has_dbg(context->mon->race->spell_flags,0xd,0xc,"context->mon->race->spell_flags"
                           ,"RSF_BR_NETH");
      if (_Var1) {
        flags = context->lore->spell_flags;
        fi = "context->lore->spell_flags";
        fl = "RSF_BR_NETH";
        size = 0xd;
        flag = 0xc;
      }
      else {
        flags = context->lore->flags;
        fi = "context->lore->flags";
        fl = "RF_EVIL";
        size = 0xc;
        flag = 0x48;
      }
      flag_on_dbg(flags,size,flag,fi,fl);
    }
  }
  _Var1 = flag_has_dbg(context->mon->race->flags,0xc,0x49,"context->mon->race->flags","RF_UNDEAD");
  if (_Var1) {
    context->hurt_msg = MON_MSG_IMMUNE;
    context->dam = L'\0';
  }
  else {
    _Var1 = flag_has_dbg(context->mon->race->flags,0xc,0x55,"context->mon->race->flags",
                         "RF_IM_NETHER");
    if (_Var1) {
      context->hurt_msg = MON_MSG_RESIST;
      context->dam = context->dam * 3;
      uVar2 = Rand_div(6);
      context->dam = context->dam / (int)(uVar2 + 7);
    }
    else {
      _Var1 = flag_has_dbg(context->mon->race->flags,0xc,0x48,"context->mon->race->flags","RF_EVIL")
      ;
      if (_Var1) {
        context->dam = context->dam / 2;
        context->hurt_msg = MON_MSG_RESIST_SOMEWHAT;
      }
    }
  }
  return;
}

Assistant:

static void project_monster_handler_NETHER(project_monster_handler_context_t *context)
{
	/* Update the lore */
	if (context->seen) {
		/* Acquire knowledge of undead type and nether resistance */
		rf_on(context->lore->flags, RF_UNDEAD);
		rf_on(context->lore->flags, RF_IM_NETHER);

		/* If it isn't undead, acquire extra knowledge */
		if (!rf_has(context->mon->race->flags, RF_UNDEAD)) {
			/* Learn this creature breathes nether if true */
			if (rsf_has(context->mon->race->spell_flags, RSF_BR_NETH)) {
				rsf_on(context->lore->spell_flags, RSF_BR_NETH);
			}

			/* Otherwise learn about evil type */
			else {
				rf_on(context->lore->flags, RF_EVIL);
			}
		}
	}

	if (rf_has(context->mon->race->flags, RF_UNDEAD)) {
		context->hurt_msg = MON_MSG_IMMUNE;
		context->dam = 0;
	}
	else if (rf_has(context->mon->race->flags, RF_IM_NETHER)) {
		context->hurt_msg = MON_MSG_RESIST;
		context->dam *= 3;
		context->dam /= (randint1(6)+6);
	}
	else if (rf_has(context->mon->race->flags, RF_EVIL)) {
		context->dam /= 2;
		context->hurt_msg = MON_MSG_RESIST_SOMEWHAT;
	}
}